

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void __thiscall ExampleAppConsole::ExampleAppConsole(ExampleAppConsole *this)

{
  ImVector<const_char_*> *this_00;
  char *local_28;
  
  this_00 = &this->Commands;
  (this->History).Size = 0;
  (this->History).Capacity = 0;
  (this->History).Data = (char **)0x0;
  (this->Commands).Size = 0;
  (this->Commands).Capacity = 0;
  (this->Commands).Data = (char **)0x0;
  (this->Items).Size = 0;
  (this->Items).Capacity = 0;
  (this->Items).Data = (char **)0x0;
  ImGuiTextFilter::ImGuiTextFilter(&this->Filter,"");
  ClearLog(this);
  memset(this,0,0x100);
  this->HistoryPos = -1;
  local_28 = "HELP";
  ImVector<const_char_*>::push_back(this_00,&local_28);
  local_28 = "HISTORY";
  ImVector<const_char_*>::push_back(this_00,&local_28);
  local_28 = "CLEAR";
  ImVector<const_char_*>::push_back(this_00,&local_28);
  local_28 = "CLASSIFY";
  ImVector<const_char_*>::push_back(this_00,&local_28);
  this->AutoScroll = true;
  this->ScrollToBottom = false;
  AddLog(this,"Welcome to Dear ImGui!");
  return;
}

Assistant:

ExampleAppConsole()
    {
        ClearLog();
        memset(InputBuf, 0, sizeof(InputBuf));
        HistoryPos = -1;

        // "CLASSIFY" is here to provide the test case where "C"+[tab] completes to "CL" and display multiple matches.
        Commands.push_back("HELP");
        Commands.push_back("HISTORY");
        Commands.push_back("CLEAR");
        Commands.push_back("CLASSIFY");
        AutoScroll = true;
        ScrollToBottom = false;
        AddLog("Welcome to Dear ImGui!");
    }